

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastMultiplier(Gia_Man_t *pNew,int *pArgA,int *pArgB,int nArgA,int nArgB,Vec_Int_t *vTemp,
                        Vec_Int_t *vRes,int fSigned)

{
  size_t sVar1;
  int *piVar2;
  int iVar3;
  Gia_Man_t *pNew_00;
  int *piVar4;
  ulong uVar5;
  undefined4 in_register_0000000c;
  uint uVar6;
  ulong uVar7;
  int *ps;
  ulong uVar8;
  long lVar9;
  int Carry;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  int *local_68;
  Gia_Man_t *local_60;
  ulong local_58;
  ulong local_50;
  int *local_48;
  int *local_40;
  int *local_38;
  
  local_70 = CONCAT44(in_register_0000000c,nArgA);
  Carry = fSigned;
  if ((nArgA < 1) || (nArgB < 1)) {
    __assert_fail("nArgA > 0 && nArgB > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x195,
                  "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  local_60 = pNew;
  if (1 < (uint)fSigned) {
    __assert_fail("fSigned == 0 || fSigned == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0x196,
                  "void Wlc_BlastMultiplier(Gia_Man_t *, int *, int *, int, int, Vec_Int_t *, Vec_Int_t *, int)"
                 );
  }
  uVar6 = nArgB + nArgA;
  local_48 = pArgA;
  if (vRes->nCap < (int)uVar6) {
    sVar1 = (ulong)uVar6 * 4;
    if (vRes->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(sVar1);
    }
    else {
      piVar4 = (int *)realloc(vRes->pArray,sVar1);
    }
    vRes->pArray = piVar4;
    if (piVar4 == (int *)0x0) goto LAB_003042d3;
    vRes->nCap = uVar6;
  }
  local_80 = (ulong)(uint)nArgB;
  memset(vRes->pArray,0,(ulong)uVar6 << 2);
  uVar7 = local_70;
  vRes->nSize = uVar6;
  local_68 = vRes->pArray;
  iVar3 = (int)local_70;
  uVar6 = iVar3 * 2;
  if (vTemp->nCap < (int)uVar6) {
    sVar1 = (ulong)uVar6 * 4;
    if (vTemp->pArray == (int *)0x0) {
      piVar4 = (int *)malloc(sVar1);
    }
    else {
      piVar4 = (int *)realloc(vTemp->pArray,sVar1);
    }
    vTemp->pArray = piVar4;
    if (piVar4 == (int *)0x0) {
LAB_003042d3:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    vTemp->nCap = uVar6;
  }
  local_78 = 0;
  local_40 = pArgB;
  memset(vTemp->pArray,0,(ulong)uVar6 << 2);
  vTemp->nSize = uVar6;
  piVar4 = vTemp->pArray;
  uVar5 = uVar7 & 0xffffffff;
  uVar8 = 1;
  if (1 < iVar3) {
    uVar8 = uVar7 & 0xffffffff;
  }
  uVar7 = local_80 & 0xffffffff;
  local_50 = 1;
  if (1 < (int)local_80) {
    local_50 = local_80 & 0xffffffff;
  }
  local_58 = uVar5;
  do {
    local_38 = local_68 + local_78;
    local_80 = local_78 + 1;
    lVar9 = 0;
    do {
      piVar2 = (int *)((long)piVar4 + lVar9 + uVar5 * 4 + -4);
      ps = piVar2;
      if (lVar9 == 0) {
        ps = local_38;
      }
      Wlc_BlastFullAdderCtrl
                (local_60,*(int *)((long)local_48 + lVar9),local_40[local_78],piVar2[1],
                 *(int *)((long)piVar4 + lVar9),(int *)((long)piVar4 + lVar9),ps,
                 (uint)((uVar5 * 4 + -4 == lVar9) != (local_80 == uVar7) && fSigned != 0));
      pNew_00 = local_60;
      piVar2 = local_68;
      lVar9 = lVar9 + 4;
    } while (uVar8 * 4 != lVar9);
    local_78 = local_80;
  } while (local_80 != local_50);
  piVar4[uVar5 + (local_58 - 1)] = fSigned;
  uVar8 = local_70 & 0xffffffff;
  if ((int)local_70 < 2) {
    uVar8 = 1;
  }
  lVar9 = 0;
  do {
    Wlc_BlastFullAdderCtrl
              (pNew_00,1,*(int *)((long)piVar4 + lVar9),*(int *)((long)piVar4 + lVar9 + uVar5 * 4),
               Carry,&Carry,(int *)((long)piVar2 + lVar9 + uVar7 * 4),0);
    lVar9 = lVar9 + 4;
  } while (uVar8 * 4 != lVar9);
  return;
}

Assistant:

void Wlc_BlastMultiplier( Gia_Man_t * pNew, int * pArgA, int * pArgB, int nArgA, int nArgB, Vec_Int_t * vTemp, Vec_Int_t * vRes, int fSigned )
{
    int * pRes, * pArgC, * pArgS, a, b, Carry = fSigned;
    assert( nArgA > 0 && nArgB > 0 );
    assert( fSigned == 0 || fSigned == 1 );
    // prepare result
    Vec_IntFill( vRes, nArgA + nArgB, 0 );
    pRes = Vec_IntArray( vRes );
    // prepare intermediate storage
    Vec_IntFill( vTemp, 2 * nArgA, 0 );
    pArgC = Vec_IntArray( vTemp );
    pArgS = pArgC + nArgA;
    // create matrix
    for ( b = 0; b < nArgB; b++ )
        for ( a = 0; a < nArgA; a++ )
            Wlc_BlastFullAdderCtrl( pNew, pArgA[a], pArgB[b], pArgS[a], pArgC[a], 
                &pArgC[a], a ? &pArgS[a-1] : &pRes[b], fSigned && ((a+1 == nArgA) ^ (b+1 == nArgB)) );
    // final addition
    pArgS[nArgA-1] = fSigned;
    for ( a = 0; a < nArgA; a++ )
        Wlc_BlastFullAdderCtrl( pNew, 1, pArgC[a], pArgS[a], Carry, &Carry, &pRes[nArgB+a], 0 );
}